

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<bool_(henson::Puppet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/src/chai/puppet.cpp:29:30)>
::do_call(Proxy_Function_Callable_Impl<bool_(henson::Puppet_&),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_puppet_cpp:29:30)>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  Type_Conversions_State *in_RDX;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar1;
  
  BVar1 = dispatch::detail::Do_Call<bool>::
          go<bool(henson::Puppet&),chai_puppet(chaiscript::ChaiScript&,henson::NameMap&,std::__cxx11::string)::__0>
                    ((anon_class_1_0_00000001_for_m_f *)in_RDI,in_RSI,in_RDX);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          typedef typename detail::Function_Signature<Func>::Return_Type Return_Type;
          return detail::Do_Call<Return_Type>::template go<Func>(m_f, params, t_conversions);
        }